

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_check::test_method(util_check *this)

{
  unique_ptr<int,_std::default_delete<int>_> *puVar1;
  int *piVar2;
  optional<int> *poVar3;
  char *pcVar4;
  undefined1 **func;
  int line;
  int line_00;
  int line_01;
  char *assertion;
  iterator in_R9;
  long in_FS_OFFSET;
  bool bVar5;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  undefined4 local_a0;
  int nine;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  NoCopyOrMove x;
  bool result;
  unique_ptr<int,_std::default_delete<int>_> p_two;
  __uniq_ptr_impl<int,_std::default_delete<int>_> local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)operator_new(4);
  *(undefined4 *)
   local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
   super__Head_base<0UL,_int_*,_false>._M_head_impl = 2;
  puVar1 = inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>>
                     ((unique_ptr<int,_std::default_delete<int>_> *)&local_58,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,0x61,"test_method","std::make_unique<int>(2)");
  p_two._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (puVar1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
  (puVar1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&local_58);
  puVar1 = inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>const&>
                     (&p_two,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,99,"test_method","p_two");
  bVar5 = *(puVar1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl == 2;
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_1_ = bVar5;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,100,"test_method","two == 2");
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_1_ = 1;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,0x65,"test_method","true");
  pcVar4 = "test_method";
  assertion = "result";
  result = bVar5;
  inline_assertion_check<true,bool_const&>
            (&result,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,0x68,"test_method","result");
  x.i = 9;
  inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
            (&x,(char *)0x6c,line,pcVar4,assertion);
  x.i = 0xc;
  inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
            (&x,(char *)0x6d,line_00,pcVar4,assertion);
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_70 = "";
  func = &local_88;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x70;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = assertion;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)func,msg);
  local_50 = 0;
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_90 = "";
  inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
            (&x,(char *)0x70,line_01,(char *)func,assertion);
  nine = (uint)(x.i != 4) * 3;
  piVar2 = inline_assertion_check<true,int>
                     (&nine,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,0x70,"test_method","(Assert(x).test() ? 3 : 0)");
  local_a0 = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_58,&local_98,0x70,1,2,piVar2,
             "inline_assertion_check<true>((inline_assertion_check<true>(x, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp\", 112, __func__, \"x\").test() ? 3 : 0), \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp\", 112, __func__, \"(Assert(x).test() ? 3 : 0)\")"
             ,&local_a0,"3");
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_5_ = 0x100000009;
  pcVar4 = "std::optional<int>{9}";
  poVar3 = inline_assertion_check<true,std::optional<int>>
                     ((optional<int> *)&local_58,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,0x74,"test_method","std::optional<int>{9}");
  nine = (poVar3->super__Optional_base<int,_true,_true>)._M_payload.
         super__Optional_payload_base<int>._M_payload._M_value;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x75;
  file_00.m_begin = (iterator)&local_b0;
  msg_00.m_end = (iterator)piVar2;
  msg_00.m_begin = pcVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c0,msg_00
            );
  local_50 = 0;
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)&PTR__lazy_ostream_011480b0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c8 = "";
  local_a0 = 9;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_58,&local_d0,0x75,1,2,&local_a0,"9",&nine,"nine");
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&p_two);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_check)
{
    // Check that Assert can forward
    const std::unique_ptr<int> p_two = Assert(std::make_unique<int>(2));
    // Check that Assert works on lvalues and rvalues
    const int two = *Assert(p_two);
    Assert(two == 2);
    Assert(true);
    // Check that Assume can be used as unary expression
    const bool result{Assume(two == 2)};
    Assert(result);

    // Check that Assert doesn't require copy/move
    NoCopyOrMove x{9};
    Assert(x).i += 3;
    Assert(x).test();

    // Check nested Asserts
    BOOST_CHECK_EQUAL(Assert((Assert(x).test() ? 3 : 0)), 3);

    // Check -Wdangling-gsl does not trigger when copying the int. (It would
    // trigger on "const int&")
    const int nine{*Assert(std::optional<int>{9})};
    BOOST_CHECK_EQUAL(9, nine);
}